

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uras.c
# Opt level: O3

void regul1(qnode_ptr_t f,int n,int sf,float trsh)

{
  undefined4 uVar1;
  undefined4 uVar2;
  param_t *ppVar3;
  pos_t pVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int i;
  undefined4 in_XMM0_Db;
  disp_vect_t u;
  float det;
  float cn;
  int num;
  pos_t sample [316];
  int local_a34;
  ulong local_a30;
  ulong local_a28;
  double local_a20;
  pos_t local_a18 [317];
  
  iVar7 = f->sizx;
  iVar8 = f->sizy;
  iVar6 = f->ofst;
  iVar9 = iVar6 * 2 + 4;
  iVar10 = (int)((double)(((iVar7 - iVar9) + -4) % n) * 0.5 + 0.5);
  iVar9 = (int)((double)(((iVar8 - iVar9) + -4) % n) * 0.5 + 0.5);
  KERNEL_X = KERNEL_X + iVar10;
  KERNEL_Y = KERNEL_Y + iVar9;
  i = iVar6 + iVar9 + 4;
  uVar5 = (ulong)(-iVar9 - 4U);
  if (i < (int)(((-iVar9 - 4U) + iVar8) - iVar6)) {
    uVar11 = (ulong)(iVar10 + 4);
    local_a20 = (double)(float)(double)CONCAT44(in_XMM0_Db,trsh);
    local_a30 = uVar5;
    local_a28 = uVar11;
    do {
      iVar9 = (int)uVar11 + iVar6;
      if (iVar9 < ((-4 - iVar10) + iVar7) - iVar6) {
        do {
          min_discr(f,i,iVar9,n,local_a18,&local_a34);
          pVar4 = min_cond(local_a18,f,n,local_a34,SUB84(local_a20,0),sf);
          det = 0.0;
          cn = 0.0;
          u.x = -100.0;
          u.y = 100.0;
          if ((ulong)pVar4 >> 0x20 != 0xffffffff && pVar4.i != -1) {
            iVar7 = f->res * pVar4.i + pVar4.j;
            u = (*f->flow_ptr)[iVar7];
            ppVar3 = *f->param_ptr[f->sizz / 2] + iVar7;
            uVar1 = ppVar3->gauss;
            uVar2 = ppVar3->cond;
            det = SUB84((double)(float)uVar1,0);
            cn = SUB84((double)(float)uVar2,0);
          }
          propagate(u,det,cn,f,i,iVar9,n);
          iVar9 = iVar9 + n;
          iVar7 = f->sizx;
          iVar6 = f->ofst;
        } while (iVar9 < ((-4 - iVar10) + iVar7) - iVar6);
        iVar8 = f->sizy;
        uVar5 = local_a30;
        uVar11 = local_a28;
      }
      i = i + n;
    } while (i < ((int)uVar5 + iVar8) - iVar6);
  }
  return;
}

Assistant:

void regul1(f,n,sf,trsh)
qnode_ptr_t f ;
int n, sf ;
float trsh ;

{ pos_t min_cond(), sample[X], rep_loc ;
  disp_vect_t vector(), u ;
  float condition(), determinant(), cond_num, det ;
  int num, xf, yf, i, j, k ;

  xf = (int)(((f->sizx-f->ofst-NRADIUS-(f->ofst+NRADIUS))%n)/2.0 + 0.5) ;
  yf = (int)(((f->sizy-f->ofst-NRADIUS-(f->ofst+NRADIUS))%n)/2.0 + 0.5) ;
  KERNEL_X += xf ;
  KERNEL_Y += yf ;

  for (i = f->ofst+NRADIUS+yf ; i < f->sizy-f->ofst-NRADIUS-yf ; i += n) {
    for (j = f->ofst+NRADIUS+xf ; j < f->sizx-f->ofst-NRADIUS-xf ; j += n) {
      min_discr(f,i,j,n,sample,&num) ;
      rep_loc = min_cond(sample,f,n,num,trsh,sf) ;
      u = vector(rep_loc,f) ;
      cond_num = condition(rep_loc,f) ;
      det = determinant(rep_loc,f) ;
      propagate(u,det,cond_num,f,i,j,n) ;
    }
  }
}